

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void init_top(mstate m,mchunkptr p,size_t psize)

{
  mchunkptr pmVar1;
  ulong local_30;
  size_t offset;
  size_t psize_local;
  mchunkptr p_local;
  mstate m_local;
  
  if (((ulong)&p->fd & 0xf) == 0) {
    local_30 = 0;
  }
  else {
    local_30 = 0x10 - ((ulong)&p->fd & 0xf) & 0xf;
  }
  pmVar1 = (mchunkptr)((long)&p->prev_foot + local_30);
  local_30 = psize - local_30;
  m->top = pmVar1;
  m->topsize = local_30;
  pmVar1->head = local_30 | 1;
  *(undefined8 *)((long)pmVar1 + local_30 + 8) = 0x50;
  m->trim_check = mparams.trim_threshold;
  return;
}

Assistant:

static void init_top(mstate m, mchunkptr p, size_t psize) {
  /* Ensure alignment */
  size_t offset = align_offset(chunk2mem(p));
  p = (mchunkptr)((char*)p + offset);
  psize -= offset;

  m->top = p;
  m->topsize = psize;
  p->head = psize | PINUSE_BIT;
  /* set size of fake trailing chunk holding overhead space only once */
  chunk_plus_offset(p, psize)->head = TOP_FOOT_SIZE;
  m->trim_check = mparams.trim_threshold; /* reset on each update */
}